

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  basic_appender<char> out_00;
  presentation_type pVar1;
  bool bVar2;
  uint uVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  basic_specs *in_RCX;
  uint in_EDX;
  long in_RSI;
  size_t in_RDI;
  uint size;
  memory_buffer buffer;
  int num_digits;
  allocator<char> *in_stack_fffffffffffffc98;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb4;
  char value_00;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  basic_appender<char> in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd0;
  undefined2 in_stack_fffffffffffffcd4;
  undefined1 in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  basic_appender<char> in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  int in_stack_fffffffffffffd04;
  int iVar6;
  basic_appender<char> in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd4c;
  format_specs *in_stack_fffffffffffffd50;
  basic_appender<char> in_stack_fffffffffffffd58;
  basic_appender<char> local_2a0;
  buffer<char> *local_298;
  basic_appender<char> local_290;
  buffer<char> *local_288;
  basic_appender<char> local_280;
  buffer<char> *local_278;
  basic_appender<char> local_270;
  bool local_265 [21];
  buffer<char> local_250 [16];
  int local_34;
  basic_specs *local_28;
  uint local_1c;
  long local_18;
  size_t local_10;
  buffer<char> *local_8;
  
  value_00 = (char)((uint)in_stack_fffffffffffffcb4 >> 0x18);
  local_34 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  pVar1 = basic_specs::type(local_28);
  switch(pVar1) {
  default:
    local_265[0] = false;
    ignore_unused<bool,char[1]>(local_265,(char (*) [1])0x3a3f8c);
  case none:
  case dec:
    local_34 = count_digits(0x38aa01);
    basic_appender<char>::basic_appender(&local_270,local_250);
    local_278 = (buffer<char> *)
                format_decimal<char,_unsigned_long,_fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffcd8,
                           CONCAT17(in_stack_fffffffffffffcd7,
                                    CONCAT16(in_stack_fffffffffffffcd6,
                                             CONCAT24(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0))),
                           (int)((ulong)in_stack_fffffffffffffcc8.container >> 0x20));
    break;
  case hex:
    bVar2 = basic_specs::alt(local_28);
    iVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd04);
    if (bVar2) {
      bVar2 = basic_specs::upper(local_28);
      iVar6 = CONCAT13((char)((uint)iVar6 >> 0x18),CONCAT12(bVar2,(short)iVar6));
      prefix_append(&local_1c,((byte)~bVar2 & 1) << 0xd | 0x5830);
    }
    local_34 = count_digits<4,unsigned_long>((unsigned_long)in_stack_fffffffffffffca0);
    basic_appender<char>::basic_appender(&local_280,local_250);
    iVar5 = local_34;
    bVar2 = basic_specs::upper(local_28);
    local_288 = (buffer<char> *)
                format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                          (iVar6,in_stack_fffffffffffffd08,
                           CONCAT44(CONCAT13(bVar2,(int3)in_stack_fffffffffffffcfc),iVar5),
                           (int)((ulong)local_18 >> 0x20),SUB81((ulong)local_18 >> 0x18,0));
    break;
  case oct:
    local_34 = count_digits<3,unsigned_long>((unsigned_long)in_stack_fffffffffffffca0);
    bVar2 = basic_specs::alt(local_28);
    if (((bVar2) && (*(int *)local_28[1].fill_data_ <= local_34)) && (local_18 != 0)) {
      prefix_append(&local_1c,0x30);
    }
    basic_appender<char>::basic_appender(&local_290,local_250);
    local_298 = (buffer<char> *)
                format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                          (in_stack_fffffffffffffd04,in_stack_fffffffffffffd08,
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x18,0));
    break;
  case bin:
    in_stack_fffffffffffffcd7 = basic_specs::alt(local_28);
    if ((bool)in_stack_fffffffffffffcd7) {
      in_stack_fffffffffffffcd6 = basic_specs::upper(local_28);
      prefix_append(&local_1c,((byte)~in_stack_fffffffffffffcd6 & 1) << 0xd | 0x4230);
    }
    in_stack_fffffffffffffcd0 =
         count_digits<1,unsigned_long>((unsigned_long)in_stack_fffffffffffffca0);
    local_34 = in_stack_fffffffffffffcd0;
    basic_appender<char>::basic_appender(&local_2a0,local_250);
    in_stack_fffffffffffffcc8 =
         format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                   (in_stack_fffffffffffffd04,in_stack_fffffffffffffd08,
                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                    (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffcf0 >> 0x18,0));
    in_stack_fffffffffffffd58 = in_stack_fffffffffffffcc8;
    break;
  case chr:
    out_00.container._4_4_ = in_stack_fffffffffffffcbc;
    out_00.container._0_4_ = in_stack_fffffffffffffcb8;
    local_8 = (buffer<char> *)
              write_char<char,fmt::v11::basic_appender<char>>
                        (out_00,value_00,
                         (format_specs *)
                         CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    goto LAB_0038ae3a;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffcc8.container >> 0x20);
  if (local_1c == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = local_1c >> 0x18;
  }
  mVar4 = to_unsigned<int>(0);
  iVar5 = uVar3 + mVar4;
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,
                               CONCAT24(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0))),iVar6
            );
  mVar4 = to_unsigned<int>(0);
  local_8 = (buffer<char> *)
            write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>(fmt::v11::basic_appender<char>,unsigned_long,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                       CONCAT44(in_stack_fffffffffffffd4c,iVar5 + mVar4),local_10,
                       (anon_class_24_3_e2c60416 *)local_250);
LAB_0038ae3a:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x38ae47);
  return (basic_appender<char>)local_8;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}